

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

TablePrinter * Catch::operator<<(long tp)

{
  int iVar1;
  undefined8 uVar2;
  ReusableStringStream *this;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  ostream *poVar6;
  int __oflag;
  string *str;
  allocator<char> local_c9;
  string local_c8 [8];
  string padding;
  value_type colInfo;
  allocator<char> local_61;
  string local_60;
  ulong local_40;
  size_type strSize;
  string colStr;
  TablePrinter *tp_local;
  
  colStr.field_2._8_8_ = tp;
  ReusableStringStream::str_abi_cxx11_((string *)&strSize,(ReusableStringStream *)(tp + 0x20));
  local_40 = std::__cxx11::string::size();
  this = (ReusableStringStream *)(colStr.field_2._8_8_ + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  str = &local_60;
  ReusableStringStream::str(this,str);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  TablePrinter::open((TablePrinter *)colStr.field_2._8_8_,(char *)str,__oflag);
  iVar1 = *(int *)(colStr.field_2._8_8_ + 0x30);
  sVar3 = std::
          vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
          ::size((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                  *)(colStr.field_2._8_8_ + 8));
  if (iVar1 == (int)sVar3 + -1) {
    *(undefined4 *)(colStr.field_2._8_8_ + 0x30) = 0xffffffff;
    std::operator<<(*(ostream **)colStr.field_2._8_8_,'\n');
  }
  *(int *)(colStr.field_2._8_8_ + 0x30) = *(int *)(colStr.field_2._8_8_ + 0x30) + 1;
  pvVar4 = std::
           vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ::operator[]((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                         *)(colStr.field_2._8_8_ + 8),(long)*(int *)(colStr.field_2._8_8_ + 0x30));
  anon_unknown_26::ColumnInfo::ColumnInfo((ColumnInfo *)((long)&padding.field_2 + 8),pvVar4);
  if (local_40 + 1 < (ulong)colInfo.name.field_2._8_8_) {
    uVar5 = ~local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,uVar5 + colInfo.name.field_2._8_8_,' ',&local_c9);
    std::allocator<char>::~allocator(&local_c9);
  }
  else {
    std::__cxx11::string::string(local_c8);
  }
  if ((int)colInfo.width == 0) {
    poVar6 = std::operator<<(*(ostream **)colStr.field_2._8_8_,(string *)&strSize);
    poVar6 = std::operator<<(poVar6,local_c8);
    std::operator<<(poVar6,' ');
  }
  else {
    poVar6 = std::operator<<(*(ostream **)colStr.field_2._8_8_,local_c8);
    poVar6 = std::operator<<(poVar6,(string *)&strSize);
    std::operator<<(poVar6,' ');
  }
  uVar2 = colStr.field_2._8_8_;
  std::__cxx11::string::~string(local_c8);
  anon_unknown_26::ColumnInfo::~ColumnInfo((ColumnInfo *)((long)&padding.field_2 + 8));
  std::__cxx11::string::~string((string *)&strSize);
  return (TablePrinter *)uVar2;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, ColumnBreak) {
        auto colStr = tp.m_oss.str();
        const auto strSize = colStr.size();
        tp.m_oss.str("");
        tp.open();
        if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
            tp.m_currentColumn = -1;
            tp.m_os << '\n';
        }
        tp.m_currentColumn++;

        auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
        auto padding = (strSize + 1 < colInfo.width)
            ? std::string(colInfo.width - (strSize + 1), ' ')
            : std::string();
        if (colInfo.justification == Justification::Left)
            tp.m_os << colStr << padding << ' ';
        else
            tp.m_os << padding << colStr << ' ';
        return tp;
    }